

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Type::_InternalParse(Type *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char *size;
  internal *piVar4;
  Rep *pRVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  bool bVar8;
  SourceContext *pSVar9;
  Option *msg;
  Field *msg_00;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  string **field_name;
  uint32 res32;
  Arena *pAVar13;
  UnknownFieldSet *unknown;
  byte *p;
  char cVar14;
  uint res;
  string *psVar15;
  StringPiece str;
  StringPiece str_00;
  pair<const_char_*,_unsigned_int> pVar16;
  pair<const_char_*,_unsigned_long> pVar17;
  string *local_70;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  int *local_58;
  RepeatedPtrFieldBase *local_50;
  ArenaStringPtr *local_48;
  InternalMetadata *local_40;
  byte *local_38;
  char *ptr_local;
  
  local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_68 = &(this->options_).super_RepeatedPtrFieldBase;
  local_50 = &(this->oneofs_).super_RepeatedPtrFieldBase;
  local_58 = &(this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
  local_60 = &(this->fields_).super_RepeatedPtrFieldBase;
  local_48 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar8 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar8) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar16 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar16.first;
        res = pVar16.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
LAB_00302b7e:
      cVar14 = '\x04';
      goto LAB_00302b73;
    }
    uVar11 = (res >> 3) - 1;
    if (uVar11 < 6) {
      pcVar12 = (char *)((long)&switchD_00302795::switchdataD_0035e310 +
                        (long)(int)(&switchD_00302795::switchdataD_0035e310)[uVar11]);
      cVar14 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar14 != '\n') goto switchD_00302795_default;
        pAVar13 = (Arena *)local_40->ptr_;
        if (((ulong)pAVar13 & 1) != 0) {
          pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
        }
        if (local_48->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (local_48,pAVar13,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar15 = local_48->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar15,(char *)local_38,ctx);
        piVar4 = (internal *)(psVar15->_M_dataplus)._M_p;
        size = (char *)psVar15->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        str.length_ = (stringpiece_ssize_type)"google.protobuf.Type.name";
        str.ptr_ = size;
        bVar8 = internal::VerifyUTF8(piVar4,str,pcVar12);
        cVar14 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        if (!bVar8) {
          cVar14 = '\x04';
        }
        break;
      case 2:
        if (cVar14 != '\x12') goto switchD_00302795_default;
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar5 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
LAB_00302a2a:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_60,(this->fields_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00302a39:
            pRVar5 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
            pRVar5->allocated_size = pRVar5->allocated_size + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::Field>
                               ((this->fields_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->fields_).super_RepeatedPtrFieldBase.current_size_;
            (this->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar5->elements[iVar3] = msg_00;
          }
          else {
            iVar3 = (this->fields_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar5->allocated_size <= iVar3) {
              if (pRVar5->allocated_size == (this->fields_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00302a2a;
              goto LAB_00302a39;
            }
            (this->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_00 = (Field *)pRVar5->elements[iVar3];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Field>
                                       (ctx,msg_00,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_00302b7e;
          cVar14 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
        break;
      case 3:
        if (cVar14 != '\x1a') goto switchD_00302795_default;
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar5 = (this->oneofs_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
LAB_00302934:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_50,(this->oneofs_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00302943:
            field_name = &local_70;
            _InternalParse();
            psVar15 = local_70;
          }
          else {
            iVar3 = (this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
            field_name = (string **)(long)iVar3;
            if (pRVar5->allocated_size <= iVar3) {
              if (pRVar5->allocated_size == (this->oneofs_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00302934;
              goto LAB_00302943;
            }
            (this->oneofs_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            psVar15 = (string *)pRVar5->elements[(long)field_name];
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar15,(char *)local_38,ctx);
          piVar4 = (internal *)(psVar15->_M_dataplus)._M_p;
          pcVar12 = (char *)psVar15->_M_string_length;
          if ((long)pcVar12 < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)pcVar12,"size_t to int conversion");
          }
          str_00.length_ = (stringpiece_ssize_type)"google.protobuf.Type.oneofs";
          str_00.ptr_ = pcVar12;
          bVar8 = internal::VerifyUTF8(piVar4,str_00,(char *)field_name);
          cVar10 = '\x04';
          if ((bVar8) && (local_38 != (byte *)0x0)) {
            cVar10 = ((ctx->super_EpsCopyInputStream).limit_end_ <= local_38) * '\t';
          }
          cVar14 = '\x02';
          if (cVar10 != '\0') {
            if (cVar10 != '\t') {
              cVar14 = cVar10;
            }
            break;
          }
        } while (*local_38 == 0x1a);
        break;
      case 4:
        if (cVar14 != '\"') goto switchD_00302795_default;
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
LAB_0030297e:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_68,(this->options_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0030298d:
            pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            pRVar5->allocated_size = pRVar5->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::Option>
                            ((this->options_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar5->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar5->allocated_size <= iVar3) {
              if (pRVar5->allocated_size == (this->options_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0030297e;
              goto LAB_0030298d;
            }
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (Option *)pRVar5->elements[iVar3];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_00302b7e;
          cVar14 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x22));
        break;
      case 5:
        if (cVar14 != '*') goto switchD_00302795_default;
        if (this->source_context_ == (SourceContext *)0x0) {
          pAVar13 = (Arena *)local_40->ptr_;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
          }
          pSVar9 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar13);
          this->source_context_ = pSVar9;
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
                                     (ctx,this->source_context_,(char *)local_38);
        goto LAB_00302b3c;
      case 6:
        if (cVar14 != '0') goto switchD_00302795_default;
        bVar1 = *p;
        auVar7._8_8_ = (long)(char)bVar1;
        auVar7._0_8_ = p + 1;
        auVar6 = auVar7._0_12_;
        if ((long)(char)bVar1 < 0) {
          bVar2 = p[1];
          res32 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar17 = internal::VarintParseSlow64((char *)p,res32);
            auVar6 = pVar17._0_12_;
          }
          else {
            auVar6._8_4_ = res32;
            auVar6._0_8_ = p + 2;
          }
        }
        local_38 = auVar6._0_8_;
        cVar14 = '\x04';
        if (local_38 != (byte *)0x0) {
          this->syntax_ = auVar6._8_4_;
          cVar14 = '\x02';
        }
      }
    }
    else {
switchD_00302795_default:
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar14 = '\r';
      }
      else {
        if (((ulong)local_40->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
LAB_00302b3c:
        cVar14 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00302b73:
    if (cVar14 != '\x02') {
      if (cVar14 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Type::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Field fields = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_fields(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string oneofs = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_oneofs();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.oneofs"));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.SourceContext source_context = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_context(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Syntax syntax = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_syntax(static_cast<PROTOBUF_NAMESPACE_ID::Syntax>(val));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}